

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O0

aom_codec_err_t
ctrl_set_max_consec_frame_drop_cbr(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  uint uVar1;
  AV1_COMP *pAVar2;
  int *local_40;
  int max_consec_drop;
  AV1_COMP *cpi;
  AV1_PRIMARY *ppi;
  __va_list_tag *args_local;
  aom_codec_alg_priv_t_conflict *ctx_local;
  aom_codec_err_t local_4;
  
  pAVar2 = ctx->ppi->cpi;
  uVar1 = args->gp_offset;
  if (uVar1 < 0x29) {
    local_40 = (int *)((long)(int)uVar1 + (long)args->reg_save_area);
    args->gp_offset = uVar1 + 8;
  }
  else {
    local_40 = (int *)args->overflow_arg_area;
    args->overflow_arg_area = local_40 + 2;
  }
  if (*local_40 < 0) {
    local_4 = AOM_CODEC_INVALID_PARAM;
  }
  else {
    (pAVar2->rc).max_consec_drop = *local_40;
    (pAVar2->rc).drop_count_consec = 0;
    local_4 = AOM_CODEC_OK;
  }
  return local_4;
}

Assistant:

static aom_codec_err_t ctrl_set_max_consec_frame_drop_cbr(
    aom_codec_alg_priv_t *ctx, va_list args) {
  AV1_PRIMARY *const ppi = ctx->ppi;
  AV1_COMP *const cpi = ppi->cpi;
  const int max_consec_drop = CAST(AV1E_SET_MAX_CONSEC_FRAME_DROP_CBR, args);
  if (max_consec_drop < 0) return AOM_CODEC_INVALID_PARAM;
  cpi->rc.max_consec_drop = max_consec_drop;
  cpi->rc.drop_count_consec = 0;
  return AOM_CODEC_OK;
}